

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::InduceFalsePositive
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,Recycler *recycler)

{
  void *falsePositive;
  Recycler *recycler_local;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *this_local;
  
  if (this->freeObjectList != (FreeObject *)0x0) {
    Recycler::TryMarkNonInterior(recycler,this->freeObjectList,(void *)0x0);
  }
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::InduceFalsePositive(Recycler * recycler)
{
    // Induce a false positive mark by marking the first object on the free list, if any.
    // Note that if the block is in the allocator, freeObjectList is not up to date.
    // So we may be marking an already-allocated block, but that's okay --
    // we call TryMark so that normal processing (including tracked object processing, etc)
    // will occur just as if we had a false reference to this object previously.

    void * falsePositive = this->freeObjectList;
    if (falsePositive != nullptr)
    {
        recycler->TryMarkNonInterior(falsePositive, nullptr);
    }
}